

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PeptData::GenCleavageSites
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PeptData *this,char *compact_sequence,size_t sequence_length)

{
  iterator iVar1;
  uint in_EAX;
  runtime_error *this_00;
  uint uVar2;
  ulong uVar3;
  undefined8 local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = (ulong)in_EAX;
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (__return_storage_ptr__,iVar1,(uint *)((long)&local_28 + 4));
  }
  else {
    *iVar1._M_current = 0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  if (this->enzyme_type_ == Trypsin) {
    local_28 = CONCAT44(local_28._4_4_,1);
    if (1 < sequence_length) {
      uVar2 = 1;
      uVar3 = 1;
      do {
        if (((compact_sequence[uVar2 - 1] == 'R') || (compact_sequence[uVar2 - 1] == 'K')) &&
           (compact_sequence[uVar3] != 'P')) {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                       iVar1,(uint *)&local_28);
          }
          else {
            *iVar1._M_current = uVar2;
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        uVar2 = (uint)local_28 + 1;
        uVar3 = (ulong)uVar2;
        local_28 = CONCAT44(local_28._4_4_,uVar2);
      } while (uVar3 < sequence_length);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Enzyme type is not supported.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<unsigned> GenCleavageSites(const char* compact_sequence, size_t sequence_length) const {
        std::vector<unsigned> cleavage_sites;
        cleavage_sites.push_back(0);
        switch (enzyme_type_) {  // to support more enzymes, simply add different cleavage rules here
        case EnzymeType::Trypsin:  // Trypsin KR
            for (unsigned index = 1; index < sequence_length; ++index) {
                if ((compact_sequence[index - 1] == 'K' || compact_sequence[index - 1] == 'R')
                    && compact_sequence[index] != 'P') {
                    cleavage_sites.push_back(index);
                }
            }
            break;
        default:
            throw std::runtime_error("Enzyme type is not supported.");
        }
        return cleavage_sites;
    }